

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  byte bVar4;
  void *Decoder_00;
  uint64_t Address_00;
  uint uVar5;
  uint uVar6;
  
  uVar6 = Insn >> 0x10 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if ((uVar2 - 0x19e < 0x1c) && ((0xf00000fU >> (uVar2 - 0x19e & 0x1f) & 1) != 0)) {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar6]);
  }
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0xc & 0xf]);
  uVar2 = MCInst_getOpcode(Inst);
  if ((uVar2 - 0x98 < 0x26) && ((0x3c0000000fU >> ((ulong)(uVar2 - 0x98) & 0x3f) & 1) != 0)) {
    uVar2 = (uint)GPRDecoderTable[uVar6];
    MCOperand_CreateReg0(Inst,uVar2);
  }
  else {
    uVar2 = (uint)GPRDecoderTable[uVar6];
  }
  MCOperand_CreateReg0(Inst,uVar2);
  uVar6 = Insn >> 0x18 & 1;
  bVar4 = (Insn & 0x1200000) != 0x1000000 & (byte)uVar6;
  Decoder_00 = (void *)(ulong)bVar4;
  uVar2 = 2;
  if (uVar6 != 0) {
    uVar2 = (uint)bVar4;
  }
  if ((Insn >> 0x19 & 1) == 0) {
    MCOperand_CreateReg0(Inst,0);
    uVar2 = (uVar2 << 0x10 | (Insn & 0x800000) >> 0xb | Insn & 0xfff) ^ 0x5000;
    goto LAB_0014e813;
  }
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn & 0xf]);
  switch(Insn >> 5 & 3) {
  case 0:
    uVar6 = 0x4000;
    break;
  case 1:
    uVar6 = 0x6000;
    break;
  case 2:
    uVar6 = 0x2000;
    break;
  case 3:
    uVar6 = 0x8000;
    bVar1 = true;
    goto LAB_0014e7de;
  }
  bVar1 = false;
LAB_0014e7de:
  uVar5 = Insn >> 7 & 0x1f;
  Decoder_00 = (void *)0xa000;
  if (!bVar1) {
    Decoder_00 = (void *)(ulong)uVar6;
  }
  if (uVar5 != 0) {
    Decoder_00 = (void *)(ulong)uVar6;
  }
  uVar2 = (uVar2 << 0x10 | (Insn & 0x800000) >> 0xb | (uint)Decoder_00 | uVar5) ^ 0x1000;
LAB_0014e813:
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
  DVar3 = (*(code *)(&DAT_001cce2c + *(int *)(&DAT_001cce2c + (ulong)DVar3 * 4)))();
  return DVar3;
}

Assistant:

static DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_AddrOpc Op;
	ARM_AM_ShiftOpc Opc;
	bool writeback;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reg = fieldFromInstruction_4(Insn, 25, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned idx_mode = 0, amt, tmp;

	// On stores, the writeback operand precedes Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STR_POST_IMM:
		case ARM_STR_POST_REG:
		case ARM_STRB_POST_IMM:
		case ARM_STRB_POST_REG:
		case ARM_STRT_POST_REG:
		case ARM_STRT_POST_IMM:
		case ARM_STRBT_POST_REG:
		case ARM_STRBT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	// On loads, the writeback operand comes after Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDR_POST_IMM:
		case ARM_LDR_POST_REG:
		case ARM_LDRB_POST_IMM:
		case ARM_LDRB_POST_REG:
		case ARM_LDRBT_POST_REG:
		case ARM_LDRBT_POST_IMM:
		case ARM_LDRT_POST_REG:
		case ARM_LDRT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	Op = ARM_AM_add;
	if (!fieldFromInstruction_4(Insn, 23, 1))
		Op = ARM_AM_sub;

	writeback = (P == 0) || (W == 1);
	if (P && writeback)
		idx_mode = ARMII_IndexModePre;
	else if (!P && writeback)
		idx_mode = ARMII_IndexModePost;

	if (writeback && (Rn == 15 || Rn == Rt))
		S = MCDisassembler_SoftFail; // UNPREDICTABLE

	if (reg) {
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		Opc = ARM_AM_lsl;
		switch( fieldFromInstruction_4(Insn, 5, 2)) {
			case 0:
				Opc = ARM_AM_lsl;
				break;
			case 1:
				Opc = ARM_AM_lsr;
				break;
			case 2:
				Opc = ARM_AM_asr;
				break;
			case 3:
				Opc = ARM_AM_ror;
				break;
			default:
				return MCDisassembler_Fail;
		}
		amt = fieldFromInstruction_4(Insn, 7, 5);
		if (Opc == ARM_AM_ror && amt == 0)
			Opc = ARM_AM_rrx;
		imm = ARM_AM_getAM2Opc(Op, amt, Opc, idx_mode);

		MCOperand_CreateImm0(Inst, imm);
	} else {
		MCOperand_CreateReg0(Inst, 0);
		tmp = ARM_AM_getAM2Opc(Op, imm, ARM_AM_lsl, idx_mode);
		MCOperand_CreateImm0(Inst, tmp);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}